

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
asl::Array<asl::Map<asl::String,_int>::KeyVal>::free
          (Array<asl::Map<asl::String,_int>::KeyVal> *this,void *__ptr)

{
  int in_EDX;
  
  asl_destroy<asl::Map<asl::String,int>::KeyVal>
            ((asl *)this->_a,(KeyVal *)(ulong)*(uint *)((long)&this->_a[-1].key.field_2 + 8),in_EDX)
  ;
  ::free((void *)((long)&this->_a[-1].key.field_2 + 8));
  this->_a = (KeyVal *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}